

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlChar *pxVar2;
  xmlXPathObjectPtr value;
  xmlChar *local_38;
  xmlChar *result;
  xmlChar *point;
  xmlXPathObjectPtr find;
  xmlXPathObjectPtr str;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 2) {
      if (ctxt->valueNr < 2) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        obj = valuePop(ctxt);
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        obj_00 = valuePop(ctxt);
        if (ctxt->error == 0) {
          pxVar2 = xmlStrstr(obj_00->stringval,obj->stringval);
          if (pxVar2 == (xmlChar *)0x0) {
            local_38 = xmlStrdup("");
          }
          else {
            iVar1 = xmlStrlen(obj->stringval);
            local_38 = xmlStrdup(pxVar2 + iVar1);
          }
          if (local_38 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          else {
            value = xmlXPathCacheWrapString(ctxt,local_38);
            valuePush(ctxt,value);
          }
        }
        xmlXPathReleaseObject(ctxt->context,obj_00);
        xmlXPathReleaseObject(ctxt->context,obj);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathSubstringAfterFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr find = NULL;
    const xmlChar *point;
    xmlChar *result;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    find = valuePop(ctxt);
    CAST_TO_STRING;
    str = valuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    point = xmlStrstr(str->stringval, find->stringval);
    if (point == NULL) {
        result = xmlStrdup(BAD_CAST "");
    } else {
        result = xmlStrdup(point + xmlStrlen(find->stringval));
    }
    if (result == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }
    valuePush(ctxt, xmlXPathCacheWrapString(ctxt, result));

error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, find);
}